

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

char * ImGui::TableGetColumnName(ImGuiTable *table,int column_n)

{
  char *pcVar1;
  long lVar2;
  
  pcVar1 = "";
  if (((table->IsLayoutLocked != false) || (column_n < table->DeclColumnsCount)) &&
     (lVar2 = (long)(table->Columns).Data[column_n].NameOffset, lVar2 != -1)) {
    pcVar1 = (table->ColumnsNames).Buf.Data + lVar2;
  }
  return pcVar1;
}

Assistant:

const char* ImGui::TableGetColumnName(const ImGuiTable* table, int column_n)
{
    if (table->IsLayoutLocked == false && column_n >= table->DeclColumnsCount)
        return ""; // NameOffset is invalid at this point
    const ImGuiTableColumn* column = &table->Columns[column_n];
    if (column->NameOffset == -1)
        return "";
    return &table->ColumnsNames.Buf[column->NameOffset];
}